

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmepoll.c
# Opt level: O3

int remove_periodic_task(select_data_ptr sd,periodic_task_handle_conflict handle)

{
  periodic_task_handle_conflict p_Var1;
  pthread_t pVar2;
  periodic_task_handle_conflict p_Var3;
  pthread_t pVar4;
  
  p_Var1 = sd->periodic_task_list;
  if (p_Var1 == handle) {
    sd->periodic_task_list = p_Var1->next;
  }
  else {
    do {
      p_Var3 = p_Var1;
      p_Var1 = p_Var3->next;
      if (p_Var1 == (periodic_task_handle)0x0) {
        return 0;
      }
    } while (p_Var1 != handle);
    p_Var3->next = p_Var1->next;
  }
  pVar2 = handle->executing;
  pVar4 = pthread_self();
  if (pVar2 != 0xffffffffffffffff && pVar2 != pVar4) {
    do {
      sched_yield();
    } while (handle->executing != 0xffffffffffffffff);
  }
  free(handle);
  sd->select_consistency_number = sd->select_consistency_number + 1;
  return 1;
}

Assistant:

static int
remove_periodic_task(select_data_ptr sd, periodic_task_handle handle)
{
    periodic_task_handle list, last = NULL;
    list = sd->periodic_task_list;
    
    while(list != handle) {
	last = list;
	list = list->next;
	if (list == NULL) {
	    return 0;
	}
    }
    /* unlink task */
    if (last == NULL) {
	sd->periodic_task_list = list->next;
    } else {
	last->next = list->next;
    }
    if (handle->executing != thr_thread_self()) {
	/* someone besides us executing this ? */
        int i = 0;
	while (handle->executing != (thr_thread_t)-1) {
	    /* wait until they're done */
	    thr_thread_yield();
	    i++;
	    if (i > 1000) {
	        /* give up */
	        continue;
	    }
	}
    }
    free(handle);
    sd->select_consistency_number++;
    return 1;
}